

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

void buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(Model *m)

{
  NeuralNetwork *nn;
  NeuralNetworkLayer *this;
  
  nn = buildBasicUpdatableNeuralNetworkModel(m);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&nn->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,"softmax");
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"softmax_out");
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(this);
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (m,nn,"cross_entropy_loss_layer","softmax_out","label_target");
  return;
}

Assistant:

void buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(Specification::Model& m) {

    auto *nn = buildBasicUpdatableNeuralNetworkModel(m);

    // set a softmax layer
    auto softmaxLayer = nn->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("B");
    softmaxLayer->add_output("softmax_out");
    softmaxLayer->mutable_softmax();

    addCategoricalCrossEntropyLoss(m, nn, "cross_entropy_loss_layer", "softmax_out", "label_target");
}